

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference pbVar5;
  char *pcVar6;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  undefined1 local_98 [8];
  string message;
  cmake *cm;
  bool fatal;
  bool status;
  const_iterator cStack_68;
  MessageType type;
  const_iterator i;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMessageCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    cStack_68 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
    cm._4_4_ = MESSAGE;
    bVar1 = false;
    bVar2 = false;
    message.field_2._8_8_ = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&stack0xffffffffffffff98);
    bVar3 = std::operator==(pbVar5,"SEND_ERROR");
    if (bVar3) {
      cm._4_4_ = FATAL_ERROR;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
    else {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xffffffffffffff98);
      bVar3 = std::operator==(pbVar5,"FATAL_ERROR");
      if (bVar3) {
        bVar2 = true;
        cm._4_4_ = FATAL_ERROR;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&stack0xffffffffffffff98);
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xffffffffffffff98);
        bVar3 = std::operator==(pbVar5,"WARNING");
        if (bVar3) {
          cm._4_4_ = WARNING;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&stack0xffffffffffffff98);
        }
        else {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&stack0xffffffffffffff98);
          bVar3 = std::operator==(pbVar5,"AUTHOR_WARNING");
          if (bVar3) {
            bVar3 = cmake::GetDevWarningsAsErrors
                              ((cmake *)message.field_2._8_8_,(this->super_cmCommand).Makefile);
            if (bVar3) {
              bVar2 = true;
              cm._4_4_ = AUTHOR_ERROR;
            }
            else {
              bVar3 = cmake::GetSuppressDevWarnings
                                ((cmake *)message.field_2._8_8_,(this->super_cmCommand).Makefile);
              if (bVar3) {
                this_local._7_1_ = 1;
                goto LAB_007651e5;
              }
              cm._4_4_ = AUTHOR_WARNING;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&stack0xffffffffffffff98);
          }
          else {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&stack0xffffffffffffff98);
            bVar3 = std::operator==(pbVar5,"STATUS");
            if (bVar3) {
              bVar1 = true;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&stack0xffffffffffffff98);
            }
            else {
              pbVar5 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&stack0xffffffffffffff98);
              bVar3 = std::operator==(pbVar5,"DEPRECATION");
              if (bVar3) {
                bVar3 = cmake::GetDeprecatedWarningsAsErrors
                                  ((cmake *)message.field_2._8_8_,(this->super_cmCommand).Makefile);
                if (bVar3) {
                  bVar2 = true;
                  cm._4_4_ = DEPRECATION_ERROR;
                }
                else {
                  bVar3 = cmake::GetSuppressDeprecatedWarnings
                                    ((cmake *)message.field_2._8_8_,(this->super_cmCommand).Makefile
                                    );
                  if (bVar3) {
                    this_local._7_1_ = 1;
                    goto LAB_007651e5;
                  }
                  cm._4_4_ = DEPRECATION_WARNING;
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&stack0xffffffffffffff98);
              }
            }
          }
        }
      }
    }
    local_b0._M_current = cStack_68._M_current;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
    local_a8 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (local_b0,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_b8);
    std::__cxx11::string::string((string *)&local_d8);
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_98,&local_a8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (cm._4_4_ == MESSAGE) {
      if (bVar1) {
        this_00 = (this->super_cmCommand).Makefile;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmMakefile::DisplayStatus(this_00,pcVar6,-1.0);
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Message(pcVar6,(char *)0x0);
      }
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,cm._4_4_,(string *)local_98,true);
    }
    if (bVar2) {
      cmSystemTools::SetFatalErrorOccured();
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_98);
  }
LAB_007651e5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMessageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();

  cmake::MessageType type = cmake::MESSAGE;
  bool status = false;
  bool fatal = false;
  cmake* cm = this->Makefile->GetCMakeInstance();
  if (*i == "SEND_ERROR")
    {
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "FATAL_ERROR")
    {
    fatal = true;
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "WARNING")
    {
    type = cmake::WARNING;
    ++i;
    }
  else if (*i == "AUTHOR_WARNING")
    {
    if (cm->GetDevWarningsAsErrors(this->Makefile))
      {
      fatal = true;
      type = cmake::AUTHOR_ERROR;
      }
    else if (!cm->GetSuppressDevWarnings(this->Makefile))
      {
      type = cmake::AUTHOR_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }
  else if (*i == "STATUS")
    {
    status = true;
    ++i;
    }
  else if (*i == "DEPRECATION")
    {
    if (cm->GetDeprecatedWarningsAsErrors(this->Makefile))
      {
      fatal = true;
      type = cmake::DEPRECATION_ERROR;
      }
    else if (!cm->GetSuppressDeprecatedWarnings(this->Makefile))
      {
      type = cmake::DEPRECATION_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != cmake::MESSAGE)
    {
    // we've overriden the message type, above, so force IssueMessage to use it
    this->Makefile->IssueMessage(type, message, true);
    }
  else
    {
    if (status)
      {
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    else
      {
      cmSystemTools::Message(message.c_str());
      }
    }
  if(fatal)
    {
    cmSystemTools::SetFatalErrorOccured();
    }
  return true;
}